

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int emit_push_const(JSParseState *s,JSValue val,BOOL as_atom)

{
  JSValue v;
  JSAtom v_00;
  BOOL BVar1;
  int iVar2;
  int in_ECX;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSParseState *in_RDI;
  JSValue JVar3;
  JSAtom atom;
  int idx;
  undefined8 in_stack_ffffffffffffffa8;
  uint32_t uVar4;
  JSParseState *s_00;
  JSValueUnion s_01;
  undefined1 in_stack_ffffffffffffffb0 [16];
  JSValueUnion in_stack_ffffffffffffffc0;
  int local_4;
  
  uVar4 = (uint32_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  if (((int)in_RDX == -7) && (in_ECX != 0)) {
    JVar3.tag = in_RDX;
    JVar3.u.ptr = in_RSI.ptr;
    JVar3 = JS_DupValue(in_RDI->ctx,JVar3);
    in_stack_ffffffffffffffc0 = JVar3.u;
    v_00 = JS_NewAtomStr(in_stack_ffffffffffffffb0._8_8_,in_stack_ffffffffffffffb0._0_8_);
    if (v_00 != 0) {
      BVar1 = __JS_AtomIsTaggedInt(v_00);
      s_00 = in_stack_ffffffffffffffb0._0_8_;
      if (BVar1 == 0) {
        emit_op((JSParseState *)in_stack_ffffffffffffffc0.ptr,in_stack_ffffffffffffffb0[0xf]);
        emit_u32(s_00,uVar4);
        return 0;
      }
    }
  }
  v.tag = in_RDX;
  v.u.ptr = in_RSI.ptr;
  JVar3 = JS_DupValue(in_RDI->ctx,v);
  iVar2 = cpool_add(in_RDI,JVar3);
  uVar4 = (uint32_t)((ulong)in_RDI >> 0x20);
  s_01 = JVar3.u;
  if (iVar2 < 0) {
    local_4 = -1;
  }
  else {
    emit_op((JSParseState *)in_stack_ffffffffffffffc0.ptr,JVar3.tag._7_1_);
    emit_u32((JSParseState *)s_01.ptr,uVar4);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static __exception int emit_push_const(JSParseState *s, JSValueConst val,
                                       BOOL as_atom)
{
    int idx;

    if (JS_VALUE_GET_TAG(val) == JS_TAG_STRING && as_atom) {
        JSAtom atom;
        /* warning: JS_NewAtomStr frees the string value */
        JS_DupValue(s->ctx, val);
        atom = JS_NewAtomStr(s->ctx, JS_VALUE_GET_STRING(val));
        if (atom != JS_ATOM_NULL && !__JS_AtomIsTaggedInt(atom)) {
            emit_op(s, OP_push_atom_value);
            emit_u32(s, atom);
            return 0;
        }
    }

    idx = cpool_add(s, JS_DupValue(s->ctx, val));
    if (idx < 0)
        return -1;
    emit_op(s, OP_push_const);
    emit_u32(s, idx);
    return 0;
}